

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void kj::Arena::destroyObject<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>>(void *pointer)

{
  long *plVar1;
  
  plVar1 = *(long **)((long)pointer + 8);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)((long)pointer + 8) = 0;
    (**(code **)**pointer)(*pointer,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }